

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  void *local_98;
  int *local_88;
  
  iVar6 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar6;
  iVar6 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar6;
  iVar6 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar6;
  iVar6 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar6;
  fVar13 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar13;
  iVar6 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar6;
  iVar6 = this->base_size;
  uVar2 = (this->ratios).w;
  uVar3 = (this->scales).w;
  iVar9 = uVar3 * uVar2;
  sVar11 = (size_t)(iVar9 * 4);
  if (iVar9 == 0) {
    local_98 = (void *)0x0;
    local_88 = (int *)0x0;
  }
  else {
    pvVar7 = malloc(sVar11 * 4 + 0x1c);
    local_98 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_98 - 8) = pvVar7;
    local_88 = (int *)((long)local_98 + sVar11 * 4);
    *local_88 = 1;
  }
  if (0 < (int)uVar2) {
    fVar13 = (float)iVar6 * 0.5;
    pvVar7 = (this->ratios).data;
    pvVar4 = (this->scales).data;
    uVar12 = 0;
    pvVar10 = local_98;
    do {
      if (0 < (int)uVar3) {
        fVar15 = *(float *)((long)pvVar7 + uVar12 * 4);
        auVar18 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar15));
        fVar14 = auVar18._0_4_;
        fVar14 = roundf(fVar14 * -0.5 * (float)iVar6 * (fVar15 * fVar14 * fVar14 + -3.0));
        fVar15 = roundf(fVar15 * (float)(int)fVar14);
        lVar8 = 0;
        do {
          fVar16 = *(float *)((long)pvVar4 + lVar8) * 0.5;
          fVar17 = fVar16 * (float)(int)fVar14;
          fVar16 = fVar16 * (float)(int)fVar15;
          pfVar1 = (float *)((long)pvVar10 + lVar8 * 4);
          *pfVar1 = fVar13 - fVar17;
          pfVar1[1] = fVar13 - fVar16;
          pfVar1[2] = fVar17 + fVar13;
          pfVar1[3] = fVar16 + fVar13;
          lVar8 = lVar8 + 4;
        } while ((ulong)uVar3 * 4 - lVar8 != 0);
      }
      uVar12 = uVar12 + 1;
      pvVar10 = (void *)((long)pvVar10 + (ulong)uVar3 * 0x10);
    } while (uVar12 != uVar2);
  }
  if (local_88 != (int *)0x0) {
    LOCK();
    *local_88 = *local_88 + 1;
    UNLOCK();
  }
  piVar5 = (this->anchors).refcount;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if ((*piVar5 == 0) && (pvVar7 = (this->anchors).data, pvVar7 != (void *)0x0)) {
      free(*(void **)((long)pvVar7 + -8));
    }
  }
  (this->anchors).data = local_98;
  (this->anchors).refcount = local_88;
  (this->anchors).elemsize = 4;
  (this->anchors).dims = 2;
  (this->anchors).w = 4;
  (this->anchors).h = iVar9;
  (this->anchors).c = 1;
  (this->anchors).cstep = sVar11;
  if (local_88 != (int *)0x0) {
    LOCK();
    *local_88 = *local_88 + -1;
    UNLOCK();
    if (local_98 != (void *)0x0 && *local_88 == 0) {
      free(*(void **)((long)local_98 - 8));
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}